

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

iterator * __thiscall Catch::clara::TextFlow::Columns::iterator::operator++(iterator *this)

{
  bool bVar1;
  iterator *piVar2;
  reference other;
  iterator *in_RDI;
  size_t i;
  iterator *this_00;
  Column *in_stack_ffffffffffffffc0;
  iterator *in_stack_ffffffffffffffd0;
  iterator *local_10;
  
  local_10 = (iterator *)0x0;
  while (this_00 = local_10,
        piVar2 = (iterator *)
                 std::
                 vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
                 ::size(in_RDI->m_columns), this_00 < piVar2) {
    other = std::
            vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
            ::operator[](&in_RDI->m_iterators,(size_type)local_10);
    std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::
    operator[](in_RDI->m_columns,(size_type)local_10);
    Column::end(in_stack_ffffffffffffffc0);
    bVar1 = Column::iterator::operator!=(this_00,other);
    if (bVar1) {
      std::
      vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
      ::operator[](&in_RDI->m_iterators,(size_type)local_10);
      Column::iterator::operator++(in_stack_ffffffffffffffd0);
    }
    local_10 = (iterator *)((long)&local_10->m_column + 1);
  }
  return in_RDI;
}

Assistant:

auto operator ++() -> iterator& {
			for (size_t i = 0; i < m_columns.size(); ++i) {
				if (m_iterators[i] != m_columns[i].end())
					++m_iterators[i];
			}
			return *this;
		}